

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,3>
          (tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [64];
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  long lVar10;
  long lVar11;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *ptVar12;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this_00;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  __m256 Cv [3] [3];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 auStack_100 [32];
  undefined1 local_e0 [32];
  undefined1 auStack_c0 [32];
  
  lVar7 = (n - n0) / 3;
  lVar14 = ((m - m0) / 3) * lVar7;
  lVar8 = (lVar14 + -1 + (long)*(int *)(this + 0x3c)) / (long)*(int *)(this + 0x3c);
  uVar4 = *(ulong *)(this + 0x18);
  lVar5 = *(long *)(this + 0x30);
  lVar10 = *(int *)(this + 0x38) * lVar8;
  lVar8 = lVar8 + lVar10;
  if (lVar14 <= lVar8) {
    lVar8 = lVar14;
  }
  ptVar12 = (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)(m0 * 4 + *(long *)(this + 0x10));
  this_00 = ptVar12;
  while( true ) {
    if (lVar8 <= lVar10) {
      return;
    }
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar3 = vmovdqu64_avx512f(auVar17);
    auStack_c0 = auVar3._32_32_;
    auVar3 = vmovdqa64_avx512f(auVar17);
    auStack_100 = auVar3._0_32_;
    local_e0 = auVar3._32_32_;
    local_140 = vmovdqa64_avx512f(auVar17);
    local_180 = vmovdqa64_avx512f(auVar17);
    local_1c0 = vmovdqa64_avx512f(auVar17);
    if ((~((long)uVar4 >> 0x3f) & uVar4) != 0) break;
    lVar14 = (long)ptVar12->iq4nlt +
             (lVar10 / lVar7) * 0xc + ((lVar10 % lVar7) * 3 + n0) * lVar5 * 4 + -0x40;
    puVar9 = local_1c0;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 4) {
        pfVar2 = (float *)(puVar9 + lVar13 * 8 + 0x10);
        pfVar1 = (float *)(puVar9 + lVar13 * 8);
        auVar15._0_4_ = *pfVar2 + *pfVar1;
        auVar15._4_4_ = pfVar2[1] + pfVar1[1];
        auVar15._8_4_ = pfVar2[2] + pfVar1[2];
        auVar15._12_4_ = pfVar2[3] + pfVar1[3];
        auVar6 = vshufpd_avx(auVar15,auVar15,1);
        auVar16._0_4_ = auVar15._0_4_ + auVar6._0_4_;
        auVar16._4_4_ = auVar15._4_4_ + auVar6._4_4_;
        auVar16._8_4_ = auVar15._8_4_ + auVar6._8_4_;
        auVar16._12_4_ = auVar15._12_4_ + auVar6._12_4_;
        auVar6 = vhaddps_avx(auVar16,auVar16);
        *(int *)(lVar14 + lVar13) = auVar6._0_4_;
      }
      lVar14 = lVar14 + lVar5 * 4;
      puVar9 = puVar9 + 0x60;
      this_00 = (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)0xc;
    }
    lVar10 = lVar10 + 1;
  }
  anon_unknown.dwarf_5500b::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::load
            ((__m256i *)
             (((lVar10 / lVar7) * 3 + m0) * *(long *)(this + 0x20) * 0x16 + *(long *)this),this_00,
             *(block_q5_0 **)(this + 0x28));
}

Assistant:

NOINLINE void gemm(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][RM] = {};
            for (int64_t l = 0; l < k; ++l)
                for (int64_t j = 0; j < RN; ++j)
                    for (int64_t i = 0; i < RM; ++i) {
#if defined(__AVX2__)
                        __m256 udTmp = updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                              load(A + lda * (ii + i) + l)),
                                             _mm256_sign_epi8(load(B + ldb * (jj + j) + l),
                                                              load(A + lda * (ii + i) + l)));
#else
                        __m128i ali0 = load0(A + lda * (ii + i) + l);
                        __m128i ali1 = load1(A + lda * (ii + i) + l);
                        __m128i blj0 = load0(B + ldb * (jj + j) + l);
                        __m128i blj1 = load1(B + ldb * (jj + j) + l);

                        __m128i sepAA0 = _mm_sign_epi8(ali0, ali0);
                        __m128i sepAA1 = _mm_sign_epi8(ali1, ali1);
                        __m128i sepBA0 = _mm_sign_epi8(blj0, ali0);
                        __m128i sepBA1 = _mm_sign_epi8(blj1, ali1);

                        // updot
                        const __m128i oneFill = _mm_set1_epi16(1);
                        __m128i mad0 = _mm_maddubs_epi16(sepAA0, sepBA0);
                        __m128i mad1 = _mm_maddubs_epi16(sepAA1, sepBA1);
                        __m256 udTmp = _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_madd_epi16(oneFill, mad1), _mm_madd_epi16(oneFill, mad0)));
#endif
                        Cv[j][i] = madd(_mm256_set1_ps(unhalf(A[lda * (ii + i) + l].d) *
                                                       unhalf(B[ldb * (jj + j) + l].d)),
                                                       udTmp,
                                                       Cv[j][i]);
                    }
            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }